

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O1

void __thiscall
KMaxDistance::addFurtherPathToNodeAVL
          (KMaxDistance *this,MaxRec *srcRec,int idxOfDstPix,double edgeCost,int numDistMaxs,
          MaxRec **maxs,NodeAVL **queue)

{
  MaxRec *nodeRec;
  ulong uVar1;
  int iVar2;
  MaxRec *dst;
  NodeAVL *pNVar3;
  KMaxDistance *pKVar4;
  ulong uVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  int numRecsToOverwrite;
  MaxRec *recsToOverWrite [2000];
  int local_3ec4;
  double local_3ec0;
  MaxRec *local_3eb8;
  undefined1 local_3eb0 [16000];
  
  nodeRec = maxs[idxOfDstPix];
  pKVar4 = this;
  local_3ec0 = edgeCost;
  dst = createNewMaxRec(this,nodeRec->imgIdx,numDistMaxs);
  dst->back = srcRec;
  copyVals(pKVar4,srcRec,dst);
  modifyDstMaxs(pKVar4,dst,local_3ec0);
  pKVar4 = this;
  iVar2 = compareVecOfMaxsWithAllVecsInNode(this,dst,nodeRec,&local_3eb8,&local_3ec4);
  if (iVar2 == 3) {
    dst->next = maxs[nodeRec->imgIdx];
    pNVar3 = avlInsert(queue,dst->sumVals,dst);
    dst->qPtr = pNVar3;
    maxs[nodeRec->imgIdx] = dst;
  }
  else if (iVar2 == 2) {
    local_3eb8->back = srcRec;
    copyVals(pKVar4,dst,local_3eb8);
    if (local_3eb8->wasMin == 0) {
      avlUpdateNode(queue,local_3eb8->qPtr,local_3eb8->sumVals);
    }
    else {
      pNVar3 = avlInsert(queue,local_3eb8->sumVals,local_3eb8);
      local_3eb8->qPtr = pNVar3;
    }
    free(dst);
    iVar2 = this->numMaxRecs;
    this->numMaxRecs = iVar2 + -1;
    if (1 < local_3ec4) {
      auVar7 = vpbroadcastq_avx512f();
      uVar5 = 0;
      auVar8 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar9 = vpbroadcastq_avx512f();
        auVar9 = vporq_avx512f(auVar9,auVar8);
        uVar1 = vpcmpuq_avx512f(auVar9,auVar7,2);
        auVar9 = vmovdqu64_avx512f(*(undefined1 (*) [64])(local_3eb0 + uVar5 * 8));
        auVar6._8_8_ = (ulong)((byte)(uVar1 >> 1) & 1) * auVar9._8_8_;
        auVar6._0_8_ = (ulong)((byte)uVar1 & 1) * auVar9._0_8_;
        auVar6._16_8_ = (ulong)((byte)(uVar1 >> 2) & 1) * auVar9._16_8_;
        auVar6._24_8_ = (ulong)((byte)(uVar1 >> 3) & 1) * auVar9._24_8_;
        vpscatterqd_avx512f(ZEXT832(0x10) + auVar6,uVar1,SUB6432(ZEXT1664((undefined1  [16])0x0),0))
        ;
        uVar5 = uVar5 + 8;
      } while ((local_3ec4 + 6U & 0xfffffff8) != uVar5);
    }
    this->numMaxRecs = iVar2 - local_3ec4;
  }
  else {
    free(dst);
    this->numMaxRecs = this->numMaxRecs + -1;
  }
  return;
}

Assistant:

void KMaxDistance::addFurtherPathToNodeAVL( MaxRec *srcRec, const int idxOfDstPix, const double edgeCost,
    const int numDistMaxs, MaxRec **maxs, NodeAVL **queue ){

    MaxRec *dstRec = maxs[idxOfDstPix];

    MaxRec *tmpRec = (MaxRec*)createNewMaxRec( dstRec->imgIdx, numDistMaxs );

    //tmpRec->back = srcRec->imgIdx;
    tmpRec->back = srcRec;
    copyVals( srcRec, tmpRec );
    modifyDstMaxs( tmpRec, edgeCost );
    //printRec( "modif: ", tmpRec, numDistMaxsGl );

    int numRecsToOverwrite;
    MaxRec* recsToOverWrite[MAX_NUM_TO_OVERWRITE];
    int compare = compareVecOfMaxsWithAllVecsInNode( tmpRec, dstRec, recsToOverWrite, &numRecsToOverwrite );
    MaxRec* recToOverWrite;
    //printf( "compare=%d\n", compare );

    switch ( compare ){

      case 2: recToOverWrite = recsToOverWrite[0];
              //recToOverWrite->back = srcRec->imgIdx;
              recToOverWrite->back = srcRec;
              copyVals( tmpRec, recToOverWrite );
              if ( recToOverWrite->wasMin ) recToOverWrite->qPtr = avlInsert( queue, recToOverWrite->sumVals, recToOverWrite );
              else avlUpdateNode( queue, recToOverWrite->qPtr, recToOverWrite->sumVals );
              free( tmpRec ); numMaxRecs--;
              for ( int i = 1; i < numRecsToOverwrite; ++i ) 
              {
                  recsToOverWrite[i]->isUsed = 0;
                  //MaxRec* prec = (MaxRec*)recsToOverWrite[i]->prev;
                  //MaxRec* nrec = (MaxRec*)recsToOverWrite[i]->next;
                  //if(prec != NULL) prec->next = nrec;
                  //if(nrec != NULL) nrec->prev = prec;
                  //free(recsToOverWrite[i]);
              }
              numMaxRecs = numMaxRecs - numRecsToOverwrite + 1;
              break;

      case 3:
              tmpRec->next = maxs[dstRec->imgIdx];
              //maxs[dstRec->imgIdx]->prev = tmpRec;
              tmpRec->qPtr = avlInsert( queue, tmpRec->sumVals, tmpRec );
              maxs[dstRec->imgIdx] = tmpRec;
              break;

      default: free( tmpRec ); numMaxRecs--; break;

    }
    
    #ifdef DEBUG_MODE
    int cnt = getNumMaxRecs( maxs[idxOfDstPix] );
    if ( cnt > numMaxRecsInOneNode ) numMaxRecsInOneNode = cnt;
    #endif

    #ifdef CHECK_NODES
    MaxRec *iRec = maxs[idxOfDstPix];
    while ( iRec != NULL ){
        if ( iRec->isUsed ){
            MaxRec *jRec = (MaxRec*)iRec->next;
            while ( jRec != NULL ){
               if ( jRec->isUsed ){
                   int result = compareTwoVecsOfMaxs( iRec, jRec );
                   if ( result != 3 ){
                       printf( "IS BAD: idxOfDstPix=%6d result=%d cnt=%2d  --->  ", idxOfDstPix, result, cnt );
                       printVals( iRec->vals, iRec->numVals, numDistMaxs );
                       printVals( jRec->vals, jRec->numVals, numDistMaxs );
                       printf( "\n" );
                   }
               }
               jRec = (MaxRec*)jRec->next;
            }
        }
        iRec = (MaxRec*)iRec->next;
    }
    #endif

}